

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small.c
# Opt level: O0

void small_mempool_create(small_alloc *alloc)

{
  uint8_t uVar1;
  uint8_t uVar2;
  uint cls;
  bool bVar3;
  small_mempool *psVar4;
  uint uVar5;
  small_mempool *pool_00;
  bool bVar6;
  small_mempool *last_pool;
  int mempool_cache_size;
  uint32_t slab_order_next;
  small_mempool *pool;
  uint32_t mempool_cache_size_1;
  size_t prevsize;
  small_mempool *psStack_28;
  _Bool first_iteration;
  small_mempool *cur_order_pool;
  size_t objsize;
  uint32_t slab_order_cur;
  small_alloc *alloc_local;
  
  uVar1 = '\0';
  cur_order_pool = (small_mempool *)0x0;
  psStack_28 = alloc->small_mempool_cache;
  alloc->small_mempool_groups_size = 0;
  bVar3 = true;
  alloc->small_mempool_cache_size = 0;
  while( true ) {
    psVar4 = cur_order_pool;
    bVar6 = false;
    if (cur_order_pool < (small_mempool *)(ulong)alloc->objsize_max) {
      bVar6 = alloc->small_mempool_cache_size < 0x400;
    }
    if (!bVar6) break;
    cls = alloc->small_mempool_cache_size;
    uVar5 = small_class_calc_size_by_offset(&alloc->small_class,cls);
    cur_order_pool = (small_mempool *)(ulong)uVar5;
    if ((small_mempool *)(ulong)alloc->objsize_max < cur_order_pool) {
      cur_order_pool = (small_mempool *)(ulong)alloc->objsize_max;
    }
    pool_00 = alloc->small_mempool_cache + cls;
    mempool_create(&pool_00->pool,alloc->cache,(uint32_t)cur_order_pool);
    *(small_mempool **)((long)&pool_00->pool + 0x68) = pool_00;
    pool_00->objsize_min = (size_t)((long)&(psVar4->pool).cache + 1);
    pool_00->group = (small_mempool_group *)0x0;
    pool_00->used_pool = (small_mempool *)0x0;
    pool_00->appropriate_pool_mask = 0;
    pool_00->waste = 0;
    if (bVar3) {
      uVar1 = (pool_00->pool).slab_order;
      bVar3 = false;
    }
    uVar2 = (pool_00->pool).slab_order;
    if (uVar2 != uVar1) {
      if ((psStack_28->pool).slab_ptr_mask != pool_00[-1].pool.slab_ptr_mask) {
        __assert_fail("cur_order_pool->pool.slab_ptr_mask == (pool - 1)->pool.slab_ptr_mask",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/small.c"
                      ,0x116,"void small_mempool_create(struct small_alloc *)");
      }
      small_mempool_create_groups(alloc,psStack_28,pool_00 + -1);
      psStack_28 = pool_00;
      uVar1 = uVar2;
    }
    alloc->small_mempool_cache_size = alloc->small_mempool_cache_size + 1;
  }
  if ((psStack_28->pool).slab_ptr_mask ==
      alloc->small_mempool_cache[(int)(alloc->small_mempool_cache_size - 1)].pool.slab_ptr_mask) {
    small_mempool_create_groups
              (alloc,psStack_28,
               alloc->small_mempool_cache + (int)(alloc->small_mempool_cache_size - 1));
    alloc->objsize_max = (uint32_t)cur_order_pool;
    return;
  }
  __assert_fail("cur_order_pool->pool.slab_ptr_mask == last_pool->pool.slab_ptr_mask",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/small.c",
                0x121,"void small_mempool_create(struct small_alloc *)");
}

Assistant:

static inline void
small_mempool_create(struct small_alloc *alloc)
{
	uint32_t slab_order_cur = 0;
	size_t objsize = 0;
	struct small_mempool *cur_order_pool = &alloc->small_mempool_cache[0];
	alloc->small_mempool_groups_size = 0;
	bool first_iteration = true;

	for (alloc->small_mempool_cache_size = 0;
	     objsize < alloc->objsize_max &&
	     alloc->small_mempool_cache_size < SMALL_MEMPOOL_MAX;
	     alloc->small_mempool_cache_size++) {
		size_t prevsize = objsize;
		uint32_t mempool_cache_size = alloc->small_mempool_cache_size;
		objsize = small_class_calc_size_by_offset(&alloc->small_class,
							  mempool_cache_size);
		if (objsize > alloc->objsize_max)
			objsize = alloc->objsize_max;
		struct small_mempool *pool =
			&alloc->small_mempool_cache[mempool_cache_size];
		mempool_create(&pool->pool, alloc->cache, objsize);
		pool->pool.small_mempool = pool;
		pool->objsize_min = prevsize + 1;
		pool->group = NULL;
		pool->used_pool = NULL;
		pool->appropriate_pool_mask = 0;
		pool->waste = 0;

		if (first_iteration) {
			slab_order_cur = pool->pool.slab_order;
			first_iteration = false;
		}
		uint32_t slab_order_next = pool->pool.slab_order;
		/*
		 * In the case when the size of slab changes, create one or
		 * more mempool groups. The count of groups depends on the
		 * mempools count with same slab size. There can be no more
		 * than 32 pools in one group.
		 */
		if (slab_order_next != slab_order_cur) {
			assert(cur_order_pool->pool.slab_ptr_mask ==
			       (pool - 1)->pool.slab_ptr_mask);
			slab_order_cur = slab_order_next;
			small_mempool_create_groups(alloc, cur_order_pool,
						    pool - 1);
			cur_order_pool = pool;
		}
	}
	int mempool_cache_size = alloc->small_mempool_cache_size;
	struct small_mempool *last_pool =
		&alloc->small_mempool_cache[mempool_cache_size - 1];
	assert(cur_order_pool->pool.slab_ptr_mask ==
	       last_pool->pool.slab_ptr_mask);
	small_mempool_create_groups(alloc, cur_order_pool, last_pool);
	alloc->objsize_max = objsize;
}